

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *vArray;
  bool bVar3;
  int local_2c;
  int LevelNew;
  int i;
  Vec_Ptr_t *vFanouts;
  Ivy_Obj_t *pFanout;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x183,"void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x184,"void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  vArray = Vec_PtrAlloc(10);
  local_2c = 0;
  Ivy_ObjCollectFanouts(p,pObj,vArray);
  while( true ) {
    iVar1 = Vec_PtrSize(vArray);
    bVar3 = false;
    if (local_2c < iVar1) {
      vFanouts = (Vec_Ptr_t *)Vec_PtrEntry(vArray,local_2c);
      bVar3 = vFanouts != (Vec_Ptr_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Ivy_ObjIsCo((Ivy_Obj_t *)vFanouts);
    if ((iVar1 == 0) &&
       (uVar2 = Ivy_ObjLevelNew((Ivy_Obj_t *)vFanouts), *(uint *)&vFanouts->pArray >> 0xb != uVar2))
    {
      *(uint *)&vFanouts->pArray = *(uint *)&vFanouts->pArray & 0x7ff | uVar2 << 0xb;
      Ivy_ObjUpdateLevel_rec(p,(Ivy_Obj_t *)vFanouts);
    }
    local_2c = local_2c + 1;
  }
  Vec_PtrFree(vArray);
  return;
}

Assistant:

void Ivy_ObjUpdateLevel_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanout;
    Vec_Ptr_t * vFanouts;
    int i, LevelNew;
    assert( p->fFanout );
    assert( Ivy_ObjIsNode(pObj) );
    vFanouts = Vec_PtrAlloc( 10 );
    Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
    {
        if ( Ivy_ObjIsCo(pFanout) )
        {
//            assert( (int)Ivy_ObjFanin0(pFanout)->Level <= p->nLevelMax );
            continue;
        }
        LevelNew = Ivy_ObjLevelNew( pFanout );
        if ( (int)pFanout->Level == LevelNew )
            continue;
        pFanout->Level = LevelNew;
        Ivy_ObjUpdateLevel_rec( p, pFanout );
    }
    Vec_PtrFree( vFanouts );
}